

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void __thiscall
btLCP::transfer_i_from_C_to_N(btLCP *this,int i,btAlignedObjectArray<float> *scratch)

{
  ulong uVar1;
  int *piVar2;
  uint n2;
  int *p;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int i2;
  ulong uVar7;
  bool bVar8;
  int in_stack_ffffffffffffffb0;
  
  n2 = this->m_nC;
  i2 = n2 - 1;
  if (0 < (int)n2) {
    p = this->m_C;
    uVar6 = 0xffffffff;
    uVar7 = 1;
    do {
      uVar3 = (uint)uVar7;
      uVar4 = uVar3 - 1;
      if (p[uVar7 - 1] != i2) {
        uVar4 = uVar6;
      }
      uVar6 = uVar4;
      if (p[uVar7 - 1] == i) {
        btLDLTRemove(this->m_A,p,this->m_L,this->m_d,this->m_nskip,n2,uVar3 - 1,this->m_nskip,
                     scratch);
        if (uVar6 != 0xffffffff) goto LAB_001cc679;
        uVar5 = uVar7;
        uVar6 = uVar3;
        if ((int)uVar3 < (int)n2) {
          uVar6 = n2;
        }
        goto LAB_001cc662;
      }
      bVar8 = uVar7 != n2;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  goto LAB_001cc69c;
  while (uVar1 = uVar5 + 1, piVar2 = p + uVar5, uVar5 = uVar1, *piVar2 != i2) {
LAB_001cc662:
    if (n2 <= uVar5) goto LAB_001cc679;
  }
  uVar6 = (int)uVar1 - 1;
LAB_001cc679:
  p[(int)uVar6] = p[uVar7 - 1];
  if ((int)(uVar3 - 1) < i2) {
    in_stack_ffffffffffffffb0 = 0x1cc69c;
    memmove(p + (uVar7 - 1),p + uVar7,(long)(int)(n2 - uVar3) << 2);
  }
LAB_001cc69c:
  btSwapProblem(this->m_A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,
                this->m_state,this->m_findex,this->m_n,i,i2,1,in_stack_ffffffffffffffb0);
  this->m_nN = this->m_nN + 1;
  this->m_nC = i2;
  return;
}

Assistant:

void btLCP::transfer_i_from_C_to_N (int i, btAlignedObjectArray<btScalar>& scratch)
{
  {
    int *C = m_C;
    // remove a row/column from the factorization, and adjust the
    // indexes (black magic!)
    int last_idx = -1;
    const int nC = m_nC;
    int j = 0;
    for ( ; j<nC; ++j) {
      if (C[j]==nC-1) {
        last_idx = j;
      }
      if (C[j]==i) {
        btLDLTRemove (m_A,C,m_L,m_d,m_n,nC,j,m_nskip,scratch);
        int k;
        if (last_idx == -1) {
          for (k=j+1 ; k<nC; ++k) {
            if (C[k]==nC-1) {
              break;
            }
          }
          btAssert (k < nC);
        }
        else {
          k = last_idx;
        }
        C[k] = C[j];
        if (j < (nC-1)) memmove (C+j,C+j+1,(nC-j-1)*sizeof(int));
        break;
      }
    }
    btAssert (j < nC);

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,i,nC-1,m_nskip,1);

    m_nN++;
    m_nC = nC - 1; // nC value is outdated after this line
  }

}